

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O1

void __thiscall
afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
defer_event<vending::events::load_goods>
          (state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,load_goods *event)

{
  size_t *psVar1;
  _Node *p_Var2;
  id_type *local_40;
  anon_class_24_2_480399db local_38;
  
  local_38.evt.p_no = event->p_no;
  local_38.evt.amount = event->amount;
  local_38.evt._12_4_ = *(undefined4 *)&event->field_0xc;
  local_40 = (id_type *)&detail::event<vending::events::load_goods>::id;
  local_38.this = this;
  p_Var2 = std::__cxx11::
           list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
           ::
           _M_create_node<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>::defer_event<vending::events::load_goods>(vending::events::load_goods&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
                     ((list<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
                       *)&this->deferred_events_,&local_38,&local_40);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->deferred_events_).
            super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  local_38.evt.p_no = (size_t)&detail::event<vending::events::load_goods>::id;
  std::
  _Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
  ::_M_insert_unique<afsm::detail::event_base::id_type_const*>
            ((_Rb_tree<afsm::detail::event_base::id_type_const*,afsm::detail::event_base::id_type_const*,std::_Identity<afsm::detail::event_base::id_type_const*>,std::less<afsm::detail::event_base::id_type_const*>,std::allocator<afsm::detail::event_base::id_type_const*>>
              *)&this->deferred_event_ids_,(id_type **)&local_38);
  return;
}

Assistant:

void
    defer_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;

        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace_back([&, evt]() mutable {
            return process_event_dispatch(::std::move(evt));
        }, &evt_identity::id);
        deferred_event_ids_.insert(&evt_identity::id);
    }